

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlAttribute * __thiscall TiXmlAttributeSet::FindOrCreate(TiXmlAttributeSet *this,char *_name)

{
  undefined8 local_20;
  TiXmlAttribute *attrib;
  char *_name_local;
  TiXmlAttributeSet *this_local;
  
  local_20 = Find(this,_name);
  if (local_20 == (TiXmlAttribute *)0x0) {
    local_20 = (TiXmlAttribute *)operator_new(0x40);
    TiXmlAttribute::TiXmlAttribute(local_20);
    Add(this,local_20);
    TiXmlAttribute::SetName(local_20,_name);
  }
  return local_20;
}

Assistant:

TiXmlAttribute* TiXmlAttributeSet::FindOrCreate( const char* _name )
{
	TiXmlAttribute* attrib = Find( _name );
	if ( !attrib ) {
		attrib = new TiXmlAttribute();
		Add( attrib );
		attrib->SetName( _name );
	}
	return attrib;
}